

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

void __thiscall Json::OurReader::skipCommentTokens(OurReader *this,Token *token)

{
  if ((this->features_).allowComments_ == true) {
    do {
      readToken(this,token);
    } while (token->type_ == tokenComment);
    return;
  }
  readToken(this,token);
  return;
}

Assistant:

void OurReader::skipCommentTokens(Token& token) {
  if (features_.allowComments_) {
    do {
      readToken(token);
    } while (token.type_ == tokenComment);
  } else {
    readToken(token);
  }
}